

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

bool CheckArgSize(FName fname,FArgumentList *args,int min,int max,FScriptPosition *sc)

{
  char *message;
  
  if ((int)args < min) {
    message = "Insufficient arguments in call to %s, expected %d, got %d";
  }
  else {
    if (max < 0 || (int)args <= max) {
      return true;
    }
    message = "Too many arguments in call to %s, expected %d, got %d";
  }
  FScriptPosition::Message(sc,2,message,FName::NameData.NameArray[fname.Index].Text,min);
  return false;
}

Assistant:

static bool CheckArgSize(FName fname, FArgumentList &args, int min, int max, FScriptPosition &sc)
{
	int s = args.Size();
	if (s < min)
	{
		sc.Message(MSG_ERROR, "Insufficient arguments in call to %s, expected %d, got %d", fname.GetChars(), min, s);
		return false;
	}
	else if (s > max && max >= 0)
	{
		sc.Message(MSG_ERROR, "Too many arguments in call to %s, expected %d, got %d", fname.GetChars(), min, s);
		return false;
	}
	return true;
}